

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O2

void xSAT_SolverRebuildOrderHeap(xSAT_Solver_t *s)

{
  xSAT_Heap_t *h;
  Vec_Int_t *p;
  char cVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  int iVar4;
  uint i;
  ulong uVar5;
  int iVar6;
  Vec_Str_t *p_01;
  
  p_01 = s->vAssigns;
  iVar4 = p_01->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar2 = iVar4;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  iVar6 = 0;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar2 << 2);
  }
  p_00->pArray = piVar3;
  for (; iVar6 < iVar4; iVar6 = iVar6 + 1) {
    cVar1 = Vec_StrEntry(p_01,iVar6);
    if (cVar1 == '\x03') {
      Vec_IntPush(p_00,iVar6);
    }
    p_01 = s->vAssigns;
    iVar4 = p_01->nSize;
  }
  h = s->hOrder;
  for (iVar4 = 0; p = h->vHeap, iVar4 < p->nSize; iVar4 = iVar4 + 1) {
    iVar2 = Vec_IntEntry(p,iVar4);
    Vec_IntWriteEntry(h->vIndices,iVar2,-1);
  }
  p->nSize = 0;
  iVar4 = p_00->nSize;
  iVar2 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
    iVar2 = 0;
  }
  for (; iVar4 != iVar2; iVar2 = iVar2 + 1) {
    iVar6 = Vec_IntEntry(p_00,iVar2);
    Vec_IntWriteEntry(h->vIndices,iVar6,iVar2);
    Vec_IntPush(h->vHeap,iVar6);
  }
  uVar5 = (long)h->vHeap->nSize / 2 & 0xffffffff;
  while (0 < (int)uVar5) {
    i = (int)uVar5 - 1;
    xSAT_HeapPercolateDown(h,i);
    uVar5 = (ulong)i;
  }
  free(p_00->pArray);
  free(p_00);
  return;
}

Assistant:

void xSAT_SolverRebuildOrderHeap( xSAT_Solver_t * s )
{
    Vec_Int_t * vTemp = Vec_IntAlloc( Vec_StrSize( s->vAssigns ) );
    int Var;

    for ( Var = 0; Var < Vec_StrSize( s->vAssigns ); Var++ )
        if ( Vec_StrEntry( s->vAssigns, Var ) == VarX )
            Vec_IntPush( vTemp, Var );

    xSAT_HeapBuild( s->hOrder, vTemp );
    Vec_IntFree( vTemp );
}